

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O0

void __thiscall duel::createDeck(duel *this,card *cards)

{
  uint uVar1;
  card *pcVar2;
  reference pvVar3;
  uint local_84;
  uint i_1;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> local_78;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> local_70;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  result_type local_58;
  long seed;
  int local_48;
  uint i;
  int type;
  allocator<card> local_31;
  undefined1 local_30 [8];
  vector<card,_std::allocator<card>_> temp;
  card *cards_local;
  duel *this_local;
  
  uVar1 = this->totalCards;
  temp.super__Vector_base<card,_std::allocator<card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = cards;
  std::allocator<card>::allocator(&local_31);
  std::vector<card,_std::allocator<card>_>::vector
            ((vector<card,_std::allocator<card>_> *)local_30,(ulong)uVar1,&local_31);
  std::allocator<card>::~allocator(&local_31);
  local_48 = 0;
  for (seed._4_4_ = 0; seed._4_4_ < this->totalCards; seed._4_4_ = seed._4_4_ + 1) {
    if ((seed._4_4_ != 0) && ((seed._4_4_ & 3) == 0)) {
      local_48 = local_48 + 1;
    }
    pcVar2 = temp.super__Vector_base<card,_std::allocator<card>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + local_48;
    pvVar3 = std::vector<card,_std::allocator<card>_>::operator[]
                       ((vector<card,_std::allocator<card>_> *)local_30,(ulong)seed._4_4_);
    card::operator=(pvVar3,pcVar2);
  }
  local_68.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_60.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_68);
  local_58 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_60);
  local_70._M_current =
       (card *)std::vector<card,_std::allocator<card>_>::begin
                         ((vector<card,_std::allocator<card>_> *)local_30);
  local_78._M_current =
       (card *)std::vector<card,_std::allocator<card>_>::end
                         ((vector<card,_std::allocator<card>_> *)local_30);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &stack0xffffffffffffff80,local_58);
  std::
  shuffle<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (local_70,local_78,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &stack0xffffffffffffff80);
  for (local_84 = 0; local_84 < this->totalCards; local_84 = local_84 + 1) {
    pvVar3 = std::vector<card,_std::allocator<card>_>::at
                       ((vector<card,_std::allocator<card>_> *)local_30,(ulong)local_84);
    std::stack<card,_std::deque<card,_std::allocator<card>_>_>::push(&this->deck,pvVar3);
  }
  std::vector<card,_std::allocator<card>_>::~vector((vector<card,_std::allocator<card>_> *)local_30)
  ;
  return;
}

Assistant:

void duel::createDeck(const card cards[]) {
    vector<card> temp(totalCards);
    int type = 0;
    // put in a filled deck in a temp vector
    for(unsigned int i = 0; i < totalCards; i++) {
        if ((i != 0) && (i % CARD_QUANTITY_MAX == 0)) ++type;
        temp[i] = cards[type];
    }
    // randomize that vector
    long seed = static_cast<long>(chrono::system_clock::now().time_since_epoch().count());
    shuffle(temp.begin(),temp.end(),default_random_engine(seed));
    // push the randomized vector to the deck
    for(unsigned int i = 0; i < totalCards; i++) {
        deck.push(temp.at(i));
    }
}